

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.cpp
# Opt level: O0

Matrix4d * __thiscall Pose::getT(Matrix4d *__return_storage_ptr__,Pose *this)

{
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar1;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98 [3];
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_80 [72];
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_38;
  Pose *local_18;
  Pose *this_local;
  Matrix4d *T;
  
  local_18 = this;
  this_local = (Pose *)__return_storage_ptr__;
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix(__return_storage_ptr__);
  getR((Matrix3d *)local_80,this);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::operator<<
            (&local_38,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)__return_storage_ptr__,local_80
            );
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_38,
                      (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this);
  local_98[0] = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar1,local_98);
  local_a0 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar1,&local_a0);
  local_a8 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar1,&local_a8);
  local_b0 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar1,&local_b0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::~CommaInitializer(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Matrix4d Pose::getT(){
      Matrix4d T;
      T <<  this->getR(), this->pos,
            0, 0, 0, 1;
      return T;
}